

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

void __thiscall
ODDLParser::DDLNode::DDLNode(DDLNode *this,string *type,string *name,size_t idx,DDLNode *parent)

{
  DDLNode *local_48 [3];
  DDLNode *local_30;
  DDLNode *parent_local;
  size_t idx_local;
  string *name_local;
  string *type_local;
  DDLNode *this_local;
  
  local_30 = parent;
  parent_local = (DDLNode *)idx;
  idx_local = (size_t)name;
  name_local = type;
  type_local = &this->m_type;
  std::__cxx11::string::string((string *)this,(string *)type);
  std::__cxx11::string::string((string *)&this->m_name,(string *)idx_local);
  this->m_parent = local_30;
  memset(&this->m_children,0,0x18);
  std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector
            (&this->m_children);
  this->m_properties = (Property *)0x0;
  this->m_value = (Value *)0x0;
  this->m_dtArrayList = (DataArrayList *)0x0;
  this->m_references = (Reference *)0x0;
  this->m_idx = (size_t)parent_local;
  if (this->m_parent != (DDLNode *)0x0) {
    local_48[0] = this;
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::push_back
              (&this->m_parent->m_children,local_48);
  }
  return;
}

Assistant:

DDLNode::DDLNode( const std::string &type, const std::string &name, size_t idx, DDLNode *parent )
: m_type( type )
, m_name( name )
, m_parent( parent )
, m_children()
, m_properties( ddl_nullptr )
, m_value( ddl_nullptr )
, m_dtArrayList( ddl_nullptr )
, m_references( ddl_nullptr )
, m_idx( idx ) {
    if( m_parent ) {
        m_parent->m_children.push_back( this );
    }
}